

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_finalize_write_http_header(lws *wsi,uchar *start,uchar **pp,uchar *end)

{
  int iVar1;
  int iVar2;
  int len;
  uchar *p;
  uchar *end_local;
  uchar **pp_local;
  uchar *start_local;
  lws *wsi_local;
  
  iVar1 = lws_finalize_http_header(wsi,pp,end);
  if (iVar1 == 0) {
    iVar1 = (int)*pp - (int)start;
    iVar2 = lws_write(wsi,start,(long)iVar1,LWS_WRITE_HTTP_HEADERS);
    if (iVar2 == iVar1) {
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_finalize_write_http_header(struct lws *wsi, unsigned char *start,
			       unsigned char **pp, unsigned char *end)
{
	unsigned char *p;
	int len;

	if (lws_finalize_http_header(wsi, pp, end))
		return 1;

	p = *pp;
	len = lws_ptr_diff(p, start);

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
	if (lws_write(wsi, start, len, LWS_WRITE_HTTP_HEADERS) != len)
		return 1;

	return 0;
}